

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O3

void isaac_set_state(isaacctx *ctx,char *buf)

{
  uint uVar1;
  int i;
  long lVar2;
  
  uVar1 = *(uint *)buf;
  ctx->cnt = uVar1;
  ctx->a = *(uint32_t *)(buf + 4);
  ctx->b = *(uint32_t *)(buf + 8);
  ctx->c = *(uint32_t *)(buf + 0xc);
  lVar2 = 0;
  do {
    ctx->rsl[lVar2] = *(uint32_t *)(buf + lVar2 * 8 + 0x10);
    ctx->mem[lVar2] = *(uint32_t *)(buf + lVar2 * 8 + 0x14);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  if (0x100 < uVar1) {
    ctx->cnt = 0;
  }
  return;
}

Assistant:

void isaac_set_state(isaacctx *ctx, const char *buf)
{
    /* decode the buffer into our context */
    ctx->cnt = osrp4(buf); buf += 4;
    ctx->a = osrp4(buf);   buf += 4;
    ctx->b = osrp4(buf);   buf += 4;
    ctx->c = osrp4(buf);   buf += 4;
    for (int i = 0 ; i < ISAAC_RANDSIZ ; ++i, buf += 8)
    {
        ctx->rsl[i] = osrp4(buf);
        ctx->mem[i] = osrp4(buf+4);
    }

    /* sanity check the result: make sure 'cnt' is in range */
    if (ctx->cnt > ISAAC_RANDSIZ)
        ctx->cnt = 0;
}